

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::hufFreeDecTable(HufDec *hdecod)

{
  void *pvVar1;
  long in_RDI;
  int i;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 0x4000; local_c = local_c + 1) {
    if (*(long *)(in_RDI + (long)local_c * 0x10 + 8) != 0) {
      pvVar1 = *(void **)(in_RDI + (long)local_c * 0x10 + 8);
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
      *(undefined8 *)(in_RDI + (long)local_c * 0x10 + 8) = 0;
    }
  }
  return;
}

Assistant:

void hufFreeDecTable(HufDec *hdecod)  // io: Decoding table
{
  for (int i = 0; i < HUF_DECSIZE; i++) {
    if (hdecod[i].p) {
      delete[] hdecod[i].p;
      hdecod[i].p = 0;
    }
  }
}